

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

void trb_print_subtree_nodes
               (trt_node *node,uint32_t max_gap_before_type,trt_wrapper wr,trt_parent_cache ca,
               trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  ulong uVar1;
  lysp_node *plVar2;
  lyspr_tree_schema *plVar3;
  trt_wrapper wr_00;
  trt_wrapper wr_01;
  trt_wrapper wr_02;
  ly_bool lVar4;
  ly_bool lVar5;
  LY_ERR LVar6;
  uint32_t uVar7;
  void *pvVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  trt_node *ptVar12;
  trt_node *ptVar13;
  bool bVar14;
  byte bVar15;
  trd_wrapper_type tVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  trt_parent_cache tVar20;
  trt_parent_cache ca_00;
  trt_parent_cache tVar21;
  trt_parent_cache ca_01;
  ly_bool ignore;
  uint32_t max_gap_before_type_1;
  uint64_t i;
  lyspr_tree_ctx plug_ctx;
  _func_void_void_ptr *p_Var22;
  ly_bool local_ed;
  uint32_t local_ec;
  long local_e8;
  lysp_node_list *local_e0;
  char *local_d8;
  uint64_t local_d0;
  lyspr_tree_schema *local_c8;
  uint64_t local_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  trt_type_type local_80;
  char *local_78;
  trt_iffeatures_type local_70;
  char *local_68;
  ly_bool local_60;
  lyspr_tree_schema *local_58;
  ulong uStack_50;
  undefined8 local_48;
  void *local_38;
  
  bVar15 = 0;
  local_e8 = CONCAT44(local_e8._4_4_,max_gap_before_type);
  plVar3 = wr._0_8_;
  if (((((node->iffeatures).type == TRD_IFF_NON_PRESENT) && ((node->type).type == TRD_TYPE_EMPTY))
      && ((node->name).str == (char *)0x0)) &&
     ((node->flags == (char *)0x0 && (node->status == (char *)0x0)))) {
    (*(pc->fp).modify.first_sibling)((trt_node *)local_b8,ca,tc);
    ptVar12 = (trt_node *)local_b8;
    ptVar13 = node;
    for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
      ptVar13->status = ptVar12->status;
      ptVar12 = (trt_node *)((long)ptVar12 + (ulong)bVar15 * -0x10 + 8);
      ptVar13 = (trt_node *)((long)ptVar13 + (ulong)bVar15 * -0x10 + 8);
    }
    goto LAB_0019c57c;
  }
  trb_print_entire_node(node,max_gap_before_type,wr,pc,tc);
  lVar4 = tc->lysc_tree;
  if (((lVar4 != '\0') && (pvVar8 = trp_ext_is_present(lVar4,tc->cn), pvVar8 != (void *)0x0)) ||
     (pvVar8 = trp_ext_is_present(lVar4,tc->pn), pvVar8 != (void *)0x0)) {
    local_48 = wr._16_8_;
    local_ed = '\0';
    local_ec = 0;
    local_58 = plVar3;
    uStack_50 = wr.bit_marks1;
    tVar21 = tro_parent_cache_for_child(ca,tc);
    local_e0 = tVar21.last_list;
    local_d8 = tVar21._0_8_;
    lVar4 = (*(pc->fp).read.if_parent_exists)(tc);
    lVar5 = (*(pc->fp).read.if_sibling_exists)(tc);
    bVar14 = lVar5 == '\0';
    if (lVar4 == '\0') {
      if (lVar5 == '\0') {
        bVar14 = (tc->plugin_ctx).last_schema != '\0';
        goto LAB_0019c184;
      }
LAB_0019c1ab:
      if (0x3f < (uint)local_48) goto LAB_0019c7db;
      uStack_50 = uStack_50 | 1L << ((byte)local_48 & 0x3f);
    }
    else {
LAB_0019c184:
      if (!bVar14) goto LAB_0019c1ab;
      if (0x3f < (uint)local_48) goto LAB_0019c7fa;
    }
    local_48 = CONCAT44(local_48._4_4_,(uint)local_48 + 1);
    local_38 = tro_next_child((&tc->pn)[(ulong)(tc->lysc_tree != '\0') * 2],tc);
    local_c0 = 0;
    pvVar8 = trb_ext_iter(tc,&local_c0);
    if (pvVar8 == (void *)0x0) {
      local_d0 = 0xffffffffffffffff;
    }
    else {
      local_d0 = 0xffffffffffffffff;
      local_c8 = (lyspr_tree_schema *)0x2;
      local_e8 = 4;
      do {
        local_b8._0_8_ = (lyspr_tree_schema *)0x0;
        local_b8._8_8_ = (char *)0x0;
        local_a8 = (_func_void_void_ptr *)0x0;
        LVar6 = tro_ext_printer_tree(tc->lysc_tree,pvVar8,(lyspr_tree_ctx *)local_b8,&local_ed);
        if (LVar6 != LY_SUCCESS) {
          tc->last_error = LVar6;
          (*(code *)((long)&DAT_001dc610 + (long)(int)(&DAT_001dc610)[local_e8]))();
          return;
        }
        if (local_ed != '\0') {
          local_ed = '\0';
          (*(code *)((long)&DAT_001dc610 + (long)(int)(&DAT_001dc610)[(long)local_c8]))();
          return;
        }
        tVar21.last_list = local_e0;
        tVar21._0_8_ = local_d8;
        trb_ext_try_unified_indent((lyspr_tree_ctx *)local_b8,tVar21,&local_ec,pc,tc);
        if ((lyspr_tree_schema *)local_b8._0_8_ != (lyspr_tree_schema *)0x0) {
          local_d0 = local_c0;
          free(&((lyspr_tree_schema *)(local_b8._0_8_ + -0x18))->field_2);
        }
        if (local_a8 != (_func_void_void_ptr *)0x0) {
          (*local_a8)((void *)local_b8._8_8_);
        }
        pvVar8 = trb_ext_iter(tc,&local_c0);
      } while (pvVar8 != (void *)0x0);
    }
    pcVar11 = local_d8;
    if (local_38 != (void *)0x0) {
      tVar20.last_list = local_e0;
      tVar20._0_8_ = local_d8;
      (*(pc->fp).modify.next_child)((trt_node *)local_b8,tVar20,tc);
      ca_00.last_list = local_e0;
      ca_00._0_8_ = pcVar11;
      uVar7 = trb_max_gap_to_type(ca_00,pc,tc);
      if (local_ec < uVar7) {
        local_ec = uVar7;
      }
      (*(pc->fp).modify.parent)(tc);
    }
    local_c0 = 0;
    pvVar8 = trb_ext_iter(tc,&local_c0);
    if (pvVar8 != (void *)0x0) {
      local_c8 = (lyspr_tree_schema *)0x5;
      local_e8 = 4;
      do {
        local_b8._0_8_ = (lyspr_tree_schema *)0x0;
        local_b8._8_8_ = (char *)0x0;
        local_a8 = (_func_void_void_ptr *)0x0;
        LVar6 = tro_ext_printer_tree(tc->lysc_tree,pvVar8,(lyspr_tree_ctx *)local_b8,&local_ed);
        if (LVar6 != LY_SUCCESS) {
          tc->last_error = LVar6;
          (*(code *)((long)&DAT_001dc62c + (long)(int)(&DAT_001dc62c)[local_e8]))();
          return;
        }
        if (local_ed != '\0') {
          local_ed = '\0';
          (*(code *)((long)&DAT_001dc62c + (long)(int)(&DAT_001dc62c)[(long)local_c8]))();
          return;
        }
        wr_00.bit_marks1._0_4_ = (int)uStack_50;
        wr_00._0_8_ = local_58;
        wr_00.bit_marks1._4_4_ = (int)(uStack_50 >> 0x20);
        wr_00._16_8_ = local_48;
        ca_01.last_list = local_e0;
        ca_01._0_8_ = local_d8;
        trb_ext_print_schemas
                  ((lyspr_tree_ctx *)local_b8,local_c0 == local_d0 && local_38 == (void *)0x0,
                   local_ec,wr_00,ca_01,pc,tc);
        if ((lyspr_tree_schema *)local_b8._0_8_ != (lyspr_tree_schema *)0x0) {
          free(&((lyspr_tree_schema *)(local_b8._0_8_ + -0x18))->field_2);
        }
        if (local_a8 != (_func_void_void_ptr *)0x0) {
          (*local_a8)((void *)local_b8._8_8_);
        }
        pvVar8 = trb_ext_iter(tc,&local_c0);
      } while (pvVar8 != (void *)0x0);
    }
  }
  lVar4 = (*(pc->fp).read.if_parent_exists)(tc);
  lVar5 = (*(pc->fp).read.if_sibling_exists)(tc);
  bVar14 = lVar5 == '\0';
  if (lVar4 == '\0') {
    if (lVar5 == '\0') {
      bVar14 = (tc->plugin_ctx).last_schema != '\0';
      goto LAB_0019c4ad;
    }
LAB_0019c4cc:
    if (0x3f < wr.actual_pos) {
LAB_0019c7db:
      __assert_fail("wr.actual_pos < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                    ,0x3b7,"struct trt_wrapper trp_wrapper_set_mark(struct trt_wrapper)");
    }
    uVar1 = wr.bit_marks1 | 1L << ((byte)wr.actual_pos & 0x3f);
    wr.bit_marks1._0_4_ = (undefined4)uVar1;
    wr.bit_marks1._4_4_ = (undefined4)(uVar1 >> 0x20);
  }
  else {
LAB_0019c4ad:
    if (!bVar14) goto LAB_0019c4cc;
    if (0x3f < wr.actual_pos) {
LAB_0019c7fa:
      __assert_fail("wr.actual_pos < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                    ,0x3a6,"struct trt_wrapper trp_wrapper_set_shift(struct trt_wrapper)");
    }
  }
  wr.actual_pos = wr.actual_pos + 1;
  ca = tro_parent_cache_for_child(ca,tc);
  (*(pc->fp).modify.next_child)((trt_node *)local_b8,ca,tc);
  ptVar12 = (trt_node *)local_b8;
  ptVar13 = node;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    ptVar13->status = ptVar12->status;
    ptVar12 = (trt_node *)((long)ptVar12 + (ulong)bVar15 * -0x10 + 8);
    ptVar13 = (trt_node *)((long)ptVar13 + (ulong)bVar15 * -0x10 + 8);
  }
  if ((((node->iffeatures).type == TRD_IFF_NON_PRESENT) && ((node->type).type == TRD_TYPE_EMPTY)) &&
     (((node->name).str == (char *)0x0 &&
      ((node->flags == (char *)0x0 && (node->status == (char *)0x0)))))) {
    return;
  }
  uVar7 = trb_max_gap_to_type(ca,pc,tc);
  local_e8 = CONCAT44(local_e8._4_4_,uVar7);
LAB_0019c57c:
  do {
    if ((tc->plugin_ctx).filtered == '\0') {
      if (tc->lysc_tree == '\0') {
        plVar2 = tc->pn->parent;
        if (((plVar2 == (lysp_node *)0x0) || ((plVar2->nodetype & 2) == 0)) ||
           ((tc->pn->nodetype & 0x6f) == 0)) goto LAB_0019c593;
        local_d8 = (char *)CONCAT44(wr.bit_marks1._4_4_,(undefined4)wr.bit_marks1);
        local_e0 = (lysp_node_list *)(ulong)wr.actual_pos;
        local_d0 = CONCAT44(local_d0._4_4_,wr._20_4_);
        local_b8._0_8_ = node->status;
        local_b8._8_8_ = "--";
        local_a8._0_5_ = CONCAT14((node->name).keys,TRD_NODE_CASE);
        local_a0 = (node->name).module_prefix;
        local_98 = (node->name).str;
        local_88 = (node->name).opts;
        local_90 = (node->name).add_opts;
        local_80 = TRD_TYPE_EMPTY;
        local_78 = (char *)0x0;
        local_70 = TRD_IFF_NON_PRESENT;
        local_68 = (char *)0x0;
        local_60 = node->last_one;
        local_c8 = plVar3;
        ly_print_(pc->out,"\n");
        wr_02._20_4_ = wr._20_4_;
        wr_02.actual_pos = wr.actual_pos;
        wr_02.bit_marks1._0_4_ = (undefined4)wr.bit_marks1;
        wr_02._0_8_ = plVar3;
        wr_02.bit_marks1._4_4_ = wr.bit_marks1._4_4_;
        trb_print_entire_node((trt_node *)local_b8,0,wr_02,pc,tc);
        ly_print_(pc->out,"\n");
        lVar4 = (*(pc->fp).read.if_sibling_exists)(tc);
        uVar9 = (uint)local_e0;
        if (lVar4 == '\0') {
          pcVar11 = local_d8;
          if (0x3f < uVar9) goto LAB_0019c7fa;
        }
        else {
          if (0x3f < uVar9) goto LAB_0019c7db;
          pcVar11 = (char *)((ulong)local_d8 | 1L << ((ulong)local_e0 & 0x3f));
        }
        local_a8 = (_func_void_void_ptr *)CONCAT44((undefined4)local_d0,uVar9 + 1);
        local_b8._0_4_ = SUB84(local_c8,0);
        local_b8._4_4_ = (undefined4)((ulong)local_c8 >> 0x20);
        local_b8._8_4_ = SUB84(pcVar11,0);
        local_b8._12_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
        tVar16 = local_b8._0_4_;
        uVar17 = local_b8._4_4_;
        uVar18 = local_b8._8_4_;
        uVar19 = local_b8._12_4_;
        p_Var22 = local_a8;
        local_b8._0_8_ = local_c8;
        local_b8._8_8_ = pcVar11;
      }
      else {
LAB_0019c593:
        ly_print_(pc->out,"\n");
        tVar16 = wr.type;
        uVar17 = wr._4_4_;
        uVar18 = (undefined4)wr.bit_marks1;
        uVar19 = wr.bit_marks1._4_4_;
        p_Var22 = (_func_void_void_ptr *)CONCAT44(wr._20_4_,wr.actual_pos);
      }
      wr_01._4_4_ = uVar17;
      wr_01.type = tVar16;
      wr_01.bit_marks1._0_4_ = uVar18;
      wr_01.bit_marks1._4_4_ = uVar19;
      wr_01._16_8_ = p_Var22;
      trb_print_subtree_nodes(node,(uint32_t)local_e8,wr_01,ca,pc,tc);
    }
    (*(pc->fp).modify.next_sibling)((trt_node *)local_b8,ca,tc);
    ptVar12 = (trt_node *)local_b8;
    ptVar13 = node;
    for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
      ptVar13->status = ptVar12->status;
      ptVar12 = (trt_node *)((long)ptVar12 + (ulong)bVar15 * -0x10 + 8);
      ptVar13 = (trt_node *)((long)ptVar13 + (ulong)bVar15 * -0x10 + 8);
    }
    if ((((node->iffeatures).type == TRD_IFF_NON_PRESENT) && ((node->type).type == TRD_TYPE_EMPTY))
       && (((node->name).str == (char *)0x0 &&
           ((node->flags == (char *)0x0 && (node->status == (char *)0x0)))))) {
      (*(pc->fp).modify.parent)(tc);
      return;
    }
  } while( true );
}

Assistant:

static void
trb_print_subtree_nodes(struct trt_node *node, uint32_t max_gap_before_type, struct trt_wrapper wr,
        struct trt_parent_cache ca, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    if (!trp_node_is_empty(node)) {
        /* Print root node. */
        trb_print_entire_node(node, max_gap_before_type, wr, pc, tc);
        if (trp_ext_is_present_in_node(tc)) {
            trb_ext_print_instances(wr, ca, pc, tc);
        }
        /* if node is last sibling, then do not add '|' to wrapper */
        wr = trb_node_is_last_sibling(&pc->fp, tc) ?
                trp_wrapper_set_shift(wr) : trp_wrapper_set_mark(wr);
        /* go to the child */
        ca = tro_parent_cache_for_child(ca, tc);
        *node = pc->fp.modify.next_child(ca, tc);
        if (trp_node_is_empty(node)) {
            return;
        }
        /* TODO comment browse through instances + filtered. try unified indentation for children */
        max_gap_before_type = trb_try_unified_indent(ca, pc, tc);
    } else {
        /* Root node is ignored, continue with child. */
        *node = pc->fp.modify.first_sibling(ca, tc);
    }

    do {
        if (!tc->plugin_ctx.filtered && !trb_need_implicit_node_case(tc)) {
            /* normal behavior */
            ly_print_(pc->out, "\n");
            trb_print_subtree_nodes(node, max_gap_before_type, wr, ca, pc, tc);
        } else if (!tc->plugin_ctx.filtered) {
            struct trt_wrapper wr_case_child;

            wr_case_child = trb_print_implicit_node(node, wr, pc, tc);
            trb_print_subtree_nodes(node, max_gap_before_type, wr_case_child, ca, pc, tc);
        }
        /* go to the actual node's sibling */
        *node = pc->fp.modify.next_sibling(ca, tc);
    } while (!trp_node_is_empty(node));

    /* get back from child node to root node */
    pc->fp.modify.parent(tc);
}